

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetTypedArrayBuffer
                  (JSContext *ctx,JSValue obj,size_t *pbyte_offset,size_t *pbyte_length,
                  size_t *pbytes_per_element)

{
  long lVar1;
  int *piVar2;
  JSRefCountHeader *p;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  
  JVar6 = obj.u;
  if (((int)obj.tag == -1) && ((ushort)(*(short *)((long)JVar6.ptr + 6) - 0x15U) < 9)) {
    lVar1 = *(long *)((long)JVar6.ptr + 0x30);
    piVar2 = *(int **)(lVar1 + 0x18);
    if (*(char *)(*(long *)(piVar2 + 0xc) + 4) == '\0') {
      if (pbyte_offset != (size_t *)0x0) {
        *pbyte_offset = (ulong)*(uint *)(lVar1 + 0x20);
      }
      if (pbyte_length != (size_t *)0x0) {
        *pbyte_length = (ulong)*(uint *)(lVar1 + 0x24);
      }
      if (pbytes_per_element != (size_t *)0x0) {
        *pbytes_per_element =
             (long)(1 << ("includes"[(ulong)*(ushort *)((long)JVar6.ptr + 6) + 1] & 0x1fU));
      }
      *piVar2 = *piVar2 + 1;
      uVar3 = (ulong)piVar2 & 0xffffffff00000000;
      uVar5 = (ulong)piVar2 & 0xffffffff;
      iVar4 = -1;
      goto LAB_00131c08;
    }
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
  }
  else {
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
  }
  uVar5 = 0;
  iVar4 = 6;
  uVar3 = 0;
LAB_00131c08:
  JVar7.tag = iVar4;
  JVar7.u.ptr = (void *)(uVar5 | uVar3);
  return JVar7;
}

Assistant:

JSValue JS_GetTypedArrayBuffer(JSContext *ctx, JSValueConst obj,
                               size_t *pbyte_offset,
                               size_t *pbyte_length,
                               size_t *pbytes_per_element)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, obj, FALSE);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    ta = p->u.typed_array;
    if (pbyte_offset)
        *pbyte_offset = ta->offset;
    if (pbyte_length)
        *pbyte_length = ta->length;
    if (pbytes_per_element) {
        *pbytes_per_element = 1 << typed_array_size_log2(p->class_id);
    }
    return JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
}